

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_relational_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  int64_t iVar1;
  JSValueUnion JVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  JSValueUnion p1;
  JSString *p2;
  JSRefCountHeader *p_1;
  JSRuntime *rt;
  JSRefCountHeader *p;
  bool bVar7;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue val;
  JSValue JVar8;
  double d2;
  double d1;
  JSValueUnion local_60;
  OPCodeEnum local_54;
  JSValueUnion local_50;
  JSValueUnion local_48;
  JSValueUnion local_40;
  JSValueUnion local_38;
  JSValueUnion JVar6;
  
  local_38 = sp[-2].u;
  local_50 = (JSValueUnion)sp[-1].u.ptr;
  iVar1 = sp[-1].tag;
  local_54 = op;
  local_40 = local_50;
  val = JS_ToPrimitiveFree(ctx,sp[-2],1);
  v_00.tag = val.tag;
  JVar6 = val.u;
  uVar4 = (uint)val.tag;
  local_38 = JVar6;
  if ((v_00.tag & 0xffffffff) == 6) {
    val.tag = iVar1;
    val.u.ptr = local_50.ptr;
    if (((uint)iVar1 < 0xfffffff5) ||
       (iVar5 = *local_50.ptr, *(int *)local_50.ptr = iVar5 + -1, 1 < iVar5)) goto LAB_0013b6ee;
    rt = ctx->rt;
    JVar6 = local_50;
  }
  else {
    JVar8.tag = iVar1;
    JVar8.u.ptr = local_50.ptr;
    JVar8 = JS_ToPrimitiveFree(ctx,JVar8,1);
    JVar2 = local_38;
    p2 = (JSString *)JVar8.tag;
    p1 = JVar8.u;
    local_40 = p1;
    if (((ulong)p2 & 0xffffffff) != 6) {
      uVar3 = (uint)JVar8.tag;
      if ((uVar4 == 0xfffffff9) && (uVar3 == 0xfffffff9)) {
        local_50 = (JSValueUnion)p2;
        uVar4 = js_string_compare((JSContext *)local_38.ptr,(JSString *)p1.ptr,p2);
        iVar5 = *JVar2.ptr;
        *(int *)JVar2.ptr = iVar5 + -1;
        if (iVar5 < 2) {
          v_00.u.float64 = JVar2.float64;
          __JS_FreeValueRT(ctx->rt,v_00);
        }
        iVar5 = *p1.ptr;
        *(int *)p1.ptr = iVar5 + -1;
        if (iVar5 < 2) {
          v_01.tag = (int64_t)local_50;
          v_01.u.float64 = p1.float64;
          __JS_FreeValueRT(ctx->rt,v_01);
        }
        if (local_54 == OP_gt) {
          bVar7 = 0 < (int)uVar4;
        }
        else {
          if (local_54 != OP_lte) {
            if (local_54 != OP_lt) {
              uVar4 = ~uVar4;
            }
            uVar4 = uVar4 >> 0x1f;
            goto LAB_0013b6d6;
          }
          bVar7 = (int)uVar4 < 1;
        }
        uVar4 = (uint)bVar7;
        goto LAB_0013b6d6;
      }
      if (uVar4 < 3) {
        JVar6.float64 = (double)val.u._0_4_;
LAB_0013b640:
        local_48 = JVar6;
        if (uVar3 < 3) {
          JVar6.float64 = (double)JVar8.u._0_4_;
        }
        else {
          JVar6 = p1;
          if ((uVar3 != 7) &&
             (iVar5 = __JS_ToFloat64Free(ctx,&local_60.float64,JVar8), JVar6 = local_60, iVar5 != 0)
             ) goto LAB_0013b687;
        }
        local_60 = JVar6;
        if (local_54 == OP_gt) {
          bVar7 = local_48.float64 < local_60.float64;
LAB_0013b6c0:
          bVar7 = !bVar7 && local_60.float64 != local_48.float64;
        }
        else {
          if (local_54 == OP_lte) {
            bVar7 = local_60.float64 < local_48.float64;
          }
          else {
            if (local_54 == OP_lt) {
              bVar7 = local_60.float64 < local_48.float64;
              goto LAB_0013b6c0;
            }
            bVar7 = local_48.float64 < local_60.float64;
          }
          bVar7 = !bVar7;
        }
        p1._1_7_ = 0;
        p1.int32._0_1_ = bVar7;
        bVar7 = true;
      }
      else {
        if ((uVar4 == 7) ||
           (iVar5 = __JS_ToFloat64Free(ctx,&local_48.float64,val), JVar6 = local_48, iVar5 == 0))
        goto LAB_0013b640;
        if ((0xfffffff4 < uVar3) && (iVar5 = *p1.ptr, *(int *)p1.ptr = iVar5 + -1, iVar5 < 2)) {
          local_60 = p1;
          __JS_FreeValueRT(ctx->rt,JVar8);
        }
LAB_0013b687:
        bVar7 = false;
      }
      uVar4 = p1.int32;
      if (bVar7) {
LAB_0013b6d6:
        JVar6._1_7_ = 0;
        JVar6.int32._0_1_ = uVar4 != 0;
        sp[-2].u = JVar6;
        sp[-2].tag = 1;
        return 0;
      }
      goto LAB_0013b6ee;
    }
    if ((uVar4 < 0xfffffff5) || (iVar5 = *JVar6.ptr, *(int *)JVar6.ptr = iVar5 + -1, 1 < iVar5))
    goto LAB_0013b6ee;
    rt = ctx->rt;
  }
  v.tag = val.tag;
  local_60 = val.u;
  v.u.ptr = JVar6.ptr;
  __JS_FreeValueRT(rt,v);
LAB_0013b6ee:
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

static no_inline int js_relational_slow(JSContext *ctx, JSValue *sp,
                                        OPCodeEnum op)
{
    JSValue op1, op2;
    int res;

    op1 = sp[-2];
    op2 = sp[-1];
    op1 = JS_ToPrimitiveFree(ctx, op1, HINT_NUMBER);
    if (JS_IsException(op1)) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    op2 = JS_ToPrimitiveFree(ctx, op2, HINT_NUMBER);
    if (JS_IsException(op2)) {
        JS_FreeValue(ctx, op1);
        goto exception;
    }
    if (JS_VALUE_GET_TAG(op1) == JS_TAG_STRING &&
        JS_VALUE_GET_TAG(op2) == JS_TAG_STRING) {
        JSString *p1, *p2;
        p1 = JS_VALUE_GET_STRING(op1);
        p2 = JS_VALUE_GET_STRING(op2);
        res = js_string_compare(ctx, p1, p2);
        JS_FreeValue(ctx, op1);
        JS_FreeValue(ctx, op2);
        switch(op) {
        case OP_lt:
            res = (res < 0);
            break;
        case OP_lte:
            res = (res <= 0);
            break;
        case OP_gt:
            res = (res > 0);
            break;
        default:
        case OP_gte:
            res = (res >= 0);
            break;
        }
    } else {
        double d1, d2;
        if (JS_ToFloat64Free(ctx, &d1, op1)) {
            JS_FreeValue(ctx, op2);
            goto exception;
        }
        if (JS_ToFloat64Free(ctx, &d2, op2))
            goto exception;
        switch(op) {
        case OP_lt:
            res = (d1 < d2); /* if NaN return false */
            break;
        case OP_lte:
            res = (d1 <= d2); /* if NaN return false */
            break;
        case OP_gt:
            res = (d1 > d2); /* if NaN return false */
            break;
        default:
        case OP_gte:
            res = (d1 >= d2); /* if NaN return false */
            break;
        }
    }
    sp[-2] = JS_NewBool(ctx, res);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}